

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlSAXUserParseFile(xmlSAXHandlerPtr sax,void *user_data,char *filename)

{
  xmlParserCtxtPtr ctxt_00;
  xmlParserCtxtPtr ctxt;
  int ret;
  char *filename_local;
  void *user_data_local;
  xmlSAXHandlerPtr sax_local;
  
  ctxt_00 = xmlCreateFileParserCtxt(filename);
  if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
    sax_local._4_4_ = -1;
  }
  else {
    if (sax != (xmlSAXHandlerPtr)0x0) {
      if (sax->initialized == 0xdeedbeaf) {
        memcpy(ctxt_00->sax,sax,0x100);
      }
      else {
        memset(ctxt_00->sax,0,0x100);
        memcpy(ctxt_00->sax,sax,0xe0);
      }
      ctxt_00->userData = user_data;
    }
    xmlParseDocument(ctxt_00);
    if (ctxt_00->wellFormed == 0) {
      if (ctxt_00->errNo == 0) {
        ctxt._4_4_ = -1;
      }
      else {
        ctxt._4_4_ = ctxt_00->errNo;
      }
    }
    else {
      ctxt._4_4_ = 0;
    }
    if (ctxt_00->myDoc != (xmlDocPtr)0x0) {
      xmlFreeDoc(ctxt_00->myDoc);
      ctxt_00->myDoc = (xmlDocPtr)0x0;
    }
    xmlFreeParserCtxt(ctxt_00);
    sax_local._4_4_ = ctxt._4_4_;
  }
  return sax_local._4_4_;
}

Assistant:

int
xmlSAXUserParseFile(xmlSAXHandlerPtr sax, void *user_data,
                    const char *filename) {
    int ret = 0;
    xmlParserCtxtPtr ctxt;

    ctxt = xmlCreateFileParserCtxt(filename);
    if (ctxt == NULL) return -1;
    if (sax != NULL) {
        if (sax->initialized == XML_SAX2_MAGIC) {
            *ctxt->sax = *sax;
        } else {
            memset(ctxt->sax, 0, sizeof(*ctxt->sax));
            memcpy(ctxt->sax, sax, sizeof(xmlSAXHandlerV1));
        }
	ctxt->userData = user_data;
    }

    xmlParseDocument(ctxt);

    if (ctxt->wellFormed)
	ret = 0;
    else {
        if (ctxt->errNo != 0)
	    ret = ctxt->errNo;
	else
	    ret = -1;
    }
    if (ctxt->myDoc != NULL) {
        xmlFreeDoc(ctxt->myDoc);
	ctxt->myDoc = NULL;
    }
    xmlFreeParserCtxt(ctxt);

    return ret;
}